

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setfvarchecked(ident *id,float val)

{
  float local_14;
  float val_local;
  ident *id_local;
  
  if ((id->flags & 8U) == 0) {
    if (((identflags & 0x10U) == 0) && ((id->flags & 2U) == 0)) {
      if ((id->flags & 0x10U) != 0) {
        id->flags = id->flags & 0xffffffef;
      }
    }
    else {
      if ((id->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",id->name);
        return;
      }
      if ((id->flags & 0x10U) == 0) {
        (id->field_5).argmask = *(uint *)(id->field_4).args;
        id->flags = id->flags | 0x10;
      }
    }
    if ((val < (id->field_2).minvalf) ||
       (local_14 = val, (id->field_3).maxvalf <= val && val != (id->field_3).maxvalf)) {
      local_14 = clampfvar(id,val,(id->field_2).minvalf,(id->field_3).maxvalf);
    }
    *(float *)(id->field_4).args = local_14;
    ident::changed(id);
  }
  else {
    debugcode("variable %s is read-only",id->name);
  }
  return;
}

Assistant:

void setfvarchecked(ident *id, float val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.f = *id->storage.f, , );
        if(val < id->minvalf || val > id->maxvalf) val = clampfvar(id, val, id->minvalf, id->maxvalf);
        *id->storage.f = val;
        id->changed();
    }
}